

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

bool __thiscall HEkk::rebuildRefactor(HEkk *this,HighsInt rebuild_reason)

{
  double dVar1;
  int in_ESI;
  long in_RDI;
  double dVar2;
  bool report_refactorization;
  double error_tolerance;
  double solution_error;
  bool refactor;
  HEkk *in_stack_00000350;
  bool local_15;
  bool local_1;
  
  if (*(int *)(in_RDI + 0x2944) == 0) {
    local_1 = false;
  }
  else {
    local_15 = true;
    if (((*(byte *)(*(long *)(in_RDI + 8) + 0x253) & 1) != 0) &&
       ((((in_ESI == 0 || (in_ESI == 3)) || (in_ESI == 4)) ||
        (((in_ESI == 5 || (in_ESI == 6)) || (in_ESI == 8)))))) {
      local_15 = false;
      dVar1 = *(double *)(*(long *)(in_RDI + 8) + 0x260);
      if (0.0 < dVar1) {
        dVar2 = factorSolveError(in_stack_00000350);
        local_15 = dVar1 < dVar2;
      }
    }
    local_1 = local_15;
  }
  return local_1;
}

Assistant:

bool HEkk::rebuildRefactor(HighsInt rebuild_reason) {
  // If no updates have been performed, then don't refactor!
  if (info_.update_count == 0) return false;
  // Otherwise, refactor by default
  bool refactor = true;
  double solution_error = 0;
  if (options_->no_unnecessary_rebuild_refactor) {
    // Consider whether not to refactor in rebuild
    //
    // Must have an INVERT just to consider this!
    assert(status_.has_invert);
    if (rebuild_reason == kRebuildReasonNo ||
        rebuild_reason == kRebuildReasonPossiblyOptimal ||
        rebuild_reason == kRebuildReasonPossiblyPhase1Feasible ||
        rebuild_reason == kRebuildReasonPossiblyPrimalUnbounded ||
        rebuild_reason == kRebuildReasonPossiblyDualUnbounded ||
        rebuild_reason == kRebuildReasonPrimalInfeasibleInPrimalSimplex) {
      // By default, don't refactor!
      refactor = false;
      // Possibly revise the decision based on accuracy when solving a
      // test system
      const double error_tolerance =
          options_->rebuild_refactor_solution_error_tolerance;
      if (error_tolerance > 0) {
        solution_error = factorSolveError();
        refactor = solution_error > error_tolerance;
      }
    }
  }
  const bool report_refactorization = false;
  if (report_refactorization) {
    const std::string logic = refactor ? "   " : "no   ";
    if (info_.update_count &&
        rebuild_reason != kRebuildReasonSyntheticClockSaysInvert)
      printf(
          "%srefactorization after %4d updates and solution error = %11.4g for "
          "rebuild reason = %s\n",
          logic.c_str(), (int)info_.update_count, solution_error,
          rebuildReason(rebuild_reason).c_str());
  }
  return refactor;
}